

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

void strpool_discard(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  strpool_internal_handle_t *psVar5;
  strpool_internal_block_t *psVar6;
  int *piVar7;
  int *piVar8;
  strpool_internal_hash_slot_t *psVar9;
  strpool_internal_entry_t *psVar10;
  char *pcVar11;
  undefined8 uVar12;
  strpool_internal_entry_t *psVar13;
  strpool_internal_entry_t *psVar14;
  int iVar15;
  uint uVar16;
  strpool_internal_free_block_t *new_entry;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  
  psVar14 = strpool_internal_get_entry(pool,handle);
  if (psVar14 == (strpool_internal_entry_t *)0x0) {
    return;
  }
  if (psVar14->refcount != 0) {
    return;
  }
  psVar5 = pool->handles;
  iVar1 = psVar14->handle_index;
  iVar2 = psVar5[iVar1].entry_index;
  if (0 < (long)pool->block_count) {
    psVar6 = pool->blocks;
    piVar7 = (int *)psVar14->data;
    lVar17 = 0;
    do {
      piVar8 = *(int **)((long)&psVar6->data + lVar17);
      if ((piVar8 <= piVar7) && (piVar7 <= *(int **)((long)&psVar6->tail + lVar17))) {
        uVar16 = *(uint *)((long)&psVar6->free_list + lVar17);
        if (-1 < (int)uVar16) {
          iVar15 = (int)piVar7 - (int)piVar8;
          uVar19 = 0xffffffff;
          goto LAB_00103fd1;
        }
        *(int *)((long)&psVar6->free_list + lVar17) = (int)piVar7 - (int)piVar8;
        piVar7[1] = -1;
        *piVar7 = psVar14->size;
        break;
      }
      lVar17 = lVar17 + 0x20;
    } while ((long)pool->block_count * 0x20 != lVar17);
  }
  goto LAB_00103ef4;
  while( true ) {
    uVar18 = (ulong)uVar16;
    iVar3 = *(int *)((long)piVar8 + uVar18);
    iVar4 = psVar14->size;
    if (iVar4 < iVar3) {
      uVar19 = (ulong)uVar16;
      uVar16 = *(uint *)((long)piVar8 + uVar18 + 4);
    }
    else {
      if ((int)uVar19 < 0) {
        piVar7[1] = *(int *)((long)&psVar6->free_list + lVar17);
        *(int *)((long)&psVar6->free_list + lVar17) = iVar15;
      }
      else {
        *(int *)((long)piVar8 + uVar19 + 4) = iVar15;
        piVar7[1] = *(int *)((long)piVar8 + uVar18 + 4);
      }
      *piVar7 = iVar4;
    }
    if (iVar3 <= iVar4) break;
LAB_00103fd1:
    if ((int)uVar16 < 0) break;
  }
LAB_00103ef4:
  if ((long)pool->handle_freelist_tail < 0) {
    if (-1 < pool->handle_freelist_head) {
      __assert_fail("pool->handle_freelist_head < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x459,"void strpool_discard(strpool_t *, unsigned long long)");
    }
    pool->handle_freelist_head = iVar1;
  }
  else {
    psVar5[pool->handle_freelist_tail].entry_index = iVar1;
  }
  pool->handle_freelist_tail = iVar1;
  psVar5[iVar1].counter = psVar5[iVar1].counter + 1;
  psVar5[iVar1].entry_index = -1;
  psVar9 = pool->hash_table;
  iVar1 = psVar14->hash_slot;
  if ((long)(int)psVar9[iVar1].hash_key != 0) {
    psVar9[(long)pool->hash_capacity - 1U & (long)(int)psVar9[iVar1].hash_key].base_count =
         psVar9[(long)pool->hash_capacity - 1U & (long)(int)psVar9[iVar1].hash_key].base_count + -1;
    psVar9[iVar1].hash_key = 0;
    lVar17 = (long)pool->entry_count + -1;
    if (iVar2 != (int)lVar17) {
      psVar10 = pool->entries;
      psVar14 = psVar10 + lVar17;
      iVar15 = psVar14->hash_slot;
      iVar3 = psVar14->handle_index;
      pcVar11 = psVar14->data;
      psVar14 = psVar10 + lVar17;
      iVar1 = psVar14->length;
      uVar12 = *(undefined8 *)(&psVar14->size + 2);
      psVar13 = psVar10 + iVar2;
      psVar13->size = psVar14->size;
      psVar13->length = iVar1;
      *(undefined8 *)(&psVar13->size + 2) = uVar12;
      psVar10 = psVar10 + iVar2;
      psVar10->hash_slot = iVar15;
      psVar10->handle_index = iVar3;
      psVar10->data = pcVar11;
      psVar14 = pool->entries;
      pool->hash_table[psVar14[iVar2].hash_slot].entry_index = iVar2;
      pool->handles[psVar14[iVar2].handle_index].entry_index = iVar2;
    }
    pool->entry_count = pool->entry_count + -1;
    return;
  }
  __assert_fail("hash",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x468,"void strpool_discard(strpool_t *, unsigned long long)");
}

Assistant:

void strpool_discard( strpool_t* pool, STRPOOL_U64 handle )
    {   
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry && entry->refcount == 0 )
        {
        int entry_index = pool->handles[ entry->handle_index ].entry_index;

        // recycle string mem
        for( int i = 0; i < pool->block_count; ++i )
            {
            strpool_internal_block_t* block = &pool->blocks[ i ];
            if( entry->data >= block->data && entry->data <= block->tail )
                {
                if( block->free_list < 0 )
                    {
                    strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                    block->free_list = (int) ( entry->data - block->data );
                    new_entry->next = -1;
                    new_entry->size = entry->size;
                    }
                else
                    {
                    int free_list = block->free_list;
                    int prev_list = -1;
                    while( free_list >= 0 )
                        {
                        strpool_internal_free_block_t* free_entry = 
                            (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + free_list );
                        if( free_entry->size <= entry->size ) 
                            {
                            strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                            if( prev_list < 0 )
                                {
                                new_entry->next = pool->blocks[ i ].free_list;
                                pool->blocks[ i ].free_list = (int) ( entry->data - block->data );          
                                }
                            else
                                {
                                strpool_internal_free_block_t* prev_entry = 
                                    (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + prev_list );
                                prev_entry->next = (int) ( entry->data - block->data );
                                new_entry->next = free_entry->next;
                                }
                            new_entry->size = entry->size;
                            break;
                            }
                        prev_list = free_list;
                        free_list = free_entry->next;
                        }
                    }
                break;
                }
            }

        // recycle handle
        if( pool->handle_freelist_tail < 0 )
            {
            STRPOOL_ASSERT( pool->handle_freelist_head < 0 );
            pool->handle_freelist_head = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        else
            {
            pool->handles[ pool->handle_freelist_tail ].entry_index = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        ++pool->handles[ entry->handle_index ].counter; // invalidate handle via counter
        pool->handles[ entry->handle_index ].entry_index = -1;

        // recycle hash slot
        STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
        int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        STRPOOL_ASSERT( hash );
        --pool->hash_table[ base_slot ].base_count;
        pool->hash_table[ entry->hash_slot ].hash_key = 0;

        // recycle entry
        if( entry_index != pool->entry_count - 1 )
            {
            pool->entries[ entry_index ] = pool->entries[ pool->entry_count - 1 ];
            pool->hash_table[ pool->entries[ entry_index ].hash_slot ].entry_index = entry_index;
            pool->handles[ pool->entries[ entry_index ].handle_index ].entry_index = entry_index;
            }
        --pool->entry_count;
        }       

    }